

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

char * jx9_value_to_string(jx9_value *pValue,int *pLen)

{
  char *pcVar1;
  
  jx9MemObjToString(pValue);
  if ((pValue->sBlob).nByte == 0) {
    pcVar1 = "";
    if (pLen != (int *)0x0) {
      *pLen = 0;
    }
  }
  else {
    SyBlobNullAppend(&pValue->sBlob);
    if (pLen != (int *)0x0) {
      *pLen = (pValue->sBlob).nByte;
    }
    pcVar1 = (char *)(pValue->sBlob).pBlob;
  }
  return pcVar1;
}

Assistant:

JX9_PRIVATE const char * jx9_value_to_string(jx9_value *pValue, int *pLen)
{
	jx9MemObjToString(pValue);
	if( SyBlobLength(&pValue->sBlob) > 0 ){
		SyBlobNullAppend(&pValue->sBlob);
		if( pLen ){
			*pLen = (int)SyBlobLength(&pValue->sBlob);
		}
		return (const char *)SyBlobData(&pValue->sBlob);
	}else{
		/* Return the empty string */
		if( pLen ){
			*pLen = 0;
		}
		return "";
	}
}